

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O0

bool __thiscall
btCollisionWorldImporter::convertAllObjects
          (btCollisionWorldImporter *this,btBulletSerializedArrays *arrays)

{
  int iVar1;
  int iVar2;
  btQuantizedBvhDoubleData **ppbVar3;
  btQuantizedBvhFloatData **ppbVar4;
  btCollisionShapeData **ppbVar5;
  btCollisionObjectDoubleData **ppbVar6;
  btCollisionObjectFloatData **ppbVar7;
  btAlignedObjectArray<btQuantizedBvhDoubleData_*> *in_RSI;
  long *in_RDI;
  btCollisionObject *body_1;
  btCollisionShape *shape_2;
  btTransform startTransform_1;
  btCollisionShape **shapePtr_1;
  btCollisionObjectFloatData *colObjData_1;
  btCollisionObject *body;
  btCollisionShape *shape_1;
  btTransform startTransform;
  btCollisionShape **shapePtr;
  btCollisionObjectDoubleData *colObjData;
  char *newname;
  btCollisionShape *shape;
  btCollisionShapeData *shapeData;
  btQuantizedBvhFloatData *bvhData_1;
  btOptimizedBvh *bvh_1;
  btQuantizedBvhDoubleData *bvhData;
  btOptimizedBvh *bvh;
  btCollisionShapeData *in_stack_000001c0;
  int i;
  btTransformDoubleData *in_stack_fffffffffffffe28;
  btHashMap<btHashPtr,_btCollisionObject_*> *in_stack_fffffffffffffe30;
  btTransform *this_00;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  char *in_stack_fffffffffffffe40;
  btCollisionWorldImporter *in_stack_fffffffffffffe48;
  btCollisionObject **in_stack_fffffffffffffe60;
  btHashString *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  int iVar8;
  btHashPtr local_160;
  undefined8 local_158;
  btCollisionShape *local_150;
  undefined1 local_148 [64];
  btHashPtr local_108;
  btCollisionShape **local_100;
  btCollisionObjectFloatData *local_f8;
  btHashPtr local_f0;
  btCollisionObject *local_e8;
  btCollisionShape *local_e0;
  undefined1 local_d8 [64];
  btHashPtr local_98;
  btCollisionShape **local_90;
  btCollisionObjectDoubleData *local_88;
  btHashString local_80;
  btHashPtr local_70;
  char *local_68;
  btHashPtr local_60;
  btCollisionShape *local_58;
  btCollisionShapeData *local_50;
  btHashPtr local_48;
  btQuantizedBvhFloatData *local_40;
  long *local_38;
  btHashPtr local_30;
  btQuantizedBvhDoubleData *local_28;
  long *local_20;
  int local_14;
  btAlignedObjectArray<btQuantizedBvhDoubleData_*> *local_10;
  
  local_10 = in_RSI;
  btHashMap<btHashPtr,_btCollisionShape_*>::clear
            ((btHashMap<btHashPtr,_btCollisionShape_*> *)in_stack_fffffffffffffe30);
  btHashMap<btHashPtr,_btCollisionObject_*>::clear(in_stack_fffffffffffffe30);
  local_14 = 0;
  while( true ) {
    iVar8 = local_14;
    iVar1 = btAlignedObjectArray<btQuantizedBvhDoubleData_*>::size(local_10);
    if (iVar1 <= iVar8) break;
    local_20 = (long *)(**(code **)(*in_RDI + 200))();
    ppbVar3 = btAlignedObjectArray<btQuantizedBvhDoubleData_*>::operator[](local_10,local_14);
    local_28 = *ppbVar3;
    (**(code **)(*local_20 + 0x30))(local_20,local_28);
    ppbVar3 = btAlignedObjectArray<btQuantizedBvhDoubleData_*>::operator[](local_10,local_14);
    btHashPtr::btHashPtr(&local_30,*ppbVar3);
    btHashMap<btHashPtr,_btOptimizedBvh_*>::insert
              ((btHashMap<btHashPtr,_btOptimizedBvh_*> *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (btHashPtr *)in_stack_fffffffffffffe68,(btOptimizedBvh **)in_stack_fffffffffffffe60);
    local_14 = local_14 + 1;
  }
  local_14 = 0;
  while( true ) {
    iVar8 = local_14;
    iVar1 = btAlignedObjectArray<btQuantizedBvhFloatData_*>::size
                      ((btAlignedObjectArray<btQuantizedBvhFloatData_*> *)(local_10 + 0x20));
    if (iVar1 <= iVar8) break;
    local_38 = (long *)(**(code **)(*in_RDI + 200))();
    ppbVar4 = btAlignedObjectArray<btQuantizedBvhFloatData_*>::operator[]
                        ((btAlignedObjectArray<btQuantizedBvhFloatData_*> *)(local_10 + 0x20),
                         local_14);
    local_40 = *ppbVar4;
    (**(code **)(*local_38 + 0x28))(local_38,local_40);
    ppbVar4 = btAlignedObjectArray<btQuantizedBvhFloatData_*>::operator[]
                        ((btAlignedObjectArray<btQuantizedBvhFloatData_*> *)(local_10 + 0x20),
                         local_14);
    btHashPtr::btHashPtr(&local_48,*ppbVar4);
    btHashMap<btHashPtr,_btOptimizedBvh_*>::insert
              ((btHashMap<btHashPtr,_btOptimizedBvh_*> *)
               CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (btHashPtr *)in_stack_fffffffffffffe68,(btOptimizedBvh **)in_stack_fffffffffffffe60);
    local_14 = local_14 + 1;
  }
  local_14 = 0;
  while( true ) {
    iVar8 = local_14;
    iVar1 = btAlignedObjectArray<btCollisionShapeData_*>::size
                      ((btAlignedObjectArray<btCollisionShapeData_*> *)(local_10 + 0x40));
    if (iVar1 <= iVar8) break;
    ppbVar5 = btAlignedObjectArray<btCollisionShapeData_*>::operator[]
                        ((btAlignedObjectArray<btCollisionShapeData_*> *)(local_10 + 0x40),local_14)
    ;
    local_50 = *ppbVar5;
    local_58 = convertCollisionShape((btCollisionWorldImporter *)arrays,in_stack_000001c0);
    if (local_58 != (btCollisionShape *)0x0) {
      in_stack_fffffffffffffe68 = (btHashString *)(in_RDI + 0x87);
      btHashPtr::btHashPtr(&local_60,local_50);
      btHashMap<btHashPtr,_btCollisionShape_*>::insert
                ((btHashMap<btHashPtr,_btCollisionShape_*> *)
                 CONCAT44(iVar8,in_stack_fffffffffffffe70),(btHashPtr *)in_stack_fffffffffffffe68,
                 (btCollisionShape **)in_stack_fffffffffffffe60);
    }
    if ((local_58 != (btCollisionShape *)0x0) && (local_50->m_name != (char *)0x0)) {
      local_68 = duplicateName(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      btHashPtr::btHashPtr(&local_70,local_58);
      btHashMap<btHashPtr,_const_char_*>::insert
                ((btHashMap<btHashPtr,_const_char_*> *)CONCAT44(iVar8,in_stack_fffffffffffffe70),
                 (btHashPtr *)in_stack_fffffffffffffe68,(char **)in_stack_fffffffffffffe60);
      in_stack_fffffffffffffe60 = (btCollisionObject **)(in_RDI + 0x57);
      btHashString::btHashString(&local_80,local_68);
      btHashMap<btHashString,_btCollisionShape_*>::insert
                ((btHashMap<btHashString,_btCollisionShape_*> *)
                 CONCAT44(iVar8,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68,
                 (btCollisionShape **)in_stack_fffffffffffffe60);
    }
    local_14 = local_14 + 1;
  }
  local_14 = 0;
  while( true ) {
    iVar1 = local_14;
    iVar2 = btAlignedObjectArray<btCollisionObjectDoubleData_*>::size
                      ((btAlignedObjectArray<btCollisionObjectDoubleData_*> *)(local_10 + 0xe0));
    if (iVar2 <= iVar1) break;
    ppbVar6 = btAlignedObjectArray<btCollisionObjectDoubleData_*>::operator[]
                        ((btAlignedObjectArray<btCollisionObjectDoubleData_*> *)(local_10 + 0xe0),
                         local_14);
    local_88 = *ppbVar6;
    btHashPtr::btHashPtr(&local_98,local_88->m_collisionShape);
    local_90 = btHashMap<btHashPtr,_btCollisionShape_*>::find
                         ((btHashMap<btHashPtr,_btCollisionShape_*> *)
                          CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                          (btHashPtr *)in_stack_fffffffffffffe30);
    if ((local_90 == (btCollisionShape **)0x0) || (*local_90 == (btCollisionShape *)0x0)) {
      printf("error: no shape found\n");
    }
    else {
      btTransform::btTransform((btTransform *)in_stack_fffffffffffffe30);
      (local_88->m_worldTransform).m_origin.m_floats[3] = 0.0;
      btTransform::deSerializeDouble
                ((btTransform *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      local_e0 = *local_90;
      local_e8 = (btCollisionObject *)
                 (**(code **)(*in_RDI + 0x18))(in_RDI,local_d8,local_e0,local_88->m_name);
      btCollisionObject::setFriction(local_e8,(float)local_88->m_friction);
      btCollisionObject::setRestitution(local_e8,(float)local_88->m_restitution);
      btHashPtr::btHashPtr(&local_f0,local_88);
      btHashMap<btHashPtr,_btCollisionObject_*>::insert
                ((btHashMap<btHashPtr,_btCollisionObject_*> *)
                 CONCAT44(iVar8,in_stack_fffffffffffffe70),(btHashPtr *)in_stack_fffffffffffffe68,
                 in_stack_fffffffffffffe60);
    }
    local_14 = local_14 + 1;
  }
  local_14 = 0;
  while( true ) {
    iVar1 = local_14;
    iVar2 = btAlignedObjectArray<btCollisionObjectFloatData_*>::size
                      ((btAlignedObjectArray<btCollisionObjectFloatData_*> *)(local_10 + 0x100));
    if (iVar2 <= iVar1) break;
    ppbVar7 = btAlignedObjectArray<btCollisionObjectFloatData_*>::operator[]
                        ((btAlignedObjectArray<btCollisionObjectFloatData_*> *)(local_10 + 0x100),
                         local_14);
    local_f8 = *ppbVar7;
    this_00 = (btTransform *)(in_RDI + 0x87);
    btHashPtr::btHashPtr(&local_108,local_f8->m_collisionShape);
    local_100 = btHashMap<btHashPtr,_btCollisionShape_*>::find
                          ((btHashMap<btHashPtr,_btCollisionShape_*> *)
                           CONCAT44(iVar1,in_stack_fffffffffffffe38),(btHashPtr *)this_00);
    if ((local_100 == (btCollisionShape **)0x0) || (*local_100 == (btCollisionShape *)0x0)) {
      printf("error: no shape found\n");
    }
    else {
      btTransform::btTransform(this_00);
      (local_f8->m_worldTransform).m_origin.m_floats[3] = 0.0;
      btTransform::deSerializeFloat(this_00,(btTransformFloatData *)in_stack_fffffffffffffe28);
      local_150 = *local_100;
      local_158 = (**(code **)(*in_RDI + 0x18))(in_RDI,local_148,local_150,local_f8->m_name);
      in_stack_fffffffffffffe28 = (btTransformDoubleData *)(in_RDI + 0x97);
      btHashPtr::btHashPtr(&local_160,local_f8);
      btHashMap<btHashPtr,_btCollisionObject_*>::insert
                ((btHashMap<btHashPtr,_btCollisionObject_*> *)
                 CONCAT44(iVar8,in_stack_fffffffffffffe70),(btHashPtr *)in_stack_fffffffffffffe68,
                 in_stack_fffffffffffffe60);
    }
    local_14 = local_14 + 1;
  }
  return true;
}

Assistant:

bool	btCollisionWorldImporter::convertAllObjects( btBulletSerializedArrays* arrays)
{

	m_shapeMap.clear();
	m_bodyMap.clear();

	int i;

	for (i=0;i<arrays->m_bvhsDouble.size();i++)
	{
		btOptimizedBvh* bvh = createOptimizedBvh();
		btQuantizedBvhDoubleData* bvhData = arrays->m_bvhsDouble[i];
		bvh->deSerializeDouble(*bvhData);
		m_bvhMap.insert(arrays->m_bvhsDouble[i],bvh);
	}
	for (i=0;i<arrays->m_bvhsFloat.size();i++)
    {
        btOptimizedBvh* bvh = createOptimizedBvh();
   		btQuantizedBvhFloatData* bvhData = arrays->m_bvhsFloat[i];
		bvh->deSerializeFloat(*bvhData);
		m_bvhMap.insert(arrays->m_bvhsFloat[i],bvh);
	}





	for (i=0;i<arrays->m_colShapeData.size();i++)
	{
		btCollisionShapeData* shapeData = arrays->m_colShapeData[i];
		btCollisionShape* shape = convertCollisionShape(shapeData);
		if (shape)
		{
	//		printf("shapeMap.insert(%x,%x)\n",shapeData,shape);
			m_shapeMap.insert(shapeData,shape);
		}

		if (shape&& shapeData->m_name)
		{
			char* newname = duplicateName(shapeData->m_name);
			m_objectNameMap.insert(shape,newname);
			m_nameShapeMap.insert(newname,shape);
		}
	}


	for (i=0;i<arrays->m_collisionObjectDataDouble.size();i++)
	{
        btCollisionObjectDoubleData* colObjData = arrays->m_collisionObjectDataDouble[i];
        btCollisionShape** shapePtr = m_shapeMap.find(colObjData->m_collisionShape);
        if (shapePtr && *shapePtr)
        {
            btTransform startTransform;
            colObjData->m_worldTransform.m_origin.m_floats[3] = 0.f;
            startTransform.deSerializeDouble(colObjData->m_worldTransform);

            btCollisionShape* shape = (btCollisionShape*)*shapePtr;
            btCollisionObject* body = createCollisionObject(startTransform,shape,colObjData->m_name);
            body->setFriction(btScalar(colObjData->m_friction));
            body->setRestitution(btScalar(colObjData->m_restitution));

#ifdef USE_INTERNAL_EDGE_UTILITY
            if (shape->getShapeType() == TRIANGLE_MESH_SHAPE_PROXYTYPE)
            {
                btBvhTriangleMeshShape* trimesh = (btBvhTriangleMeshShape*)shape;
                if (trimesh->getTriangleInfoMap())
                {
                    body->setCollisionFlags(body->getCollisionFlags()  | btCollisionObject::CF_CUSTOM_MATERIAL_CALLBACK);
                }
            }
#endif //USE_INTERNAL_EDGE_UTILITY
            m_bodyMap.insert(colObjData,body);
        } else
        {
            printf("error: no shape found\n");
        }
	}
	for (i=0;i<arrays->m_collisionObjectDataFloat.size();i++)
	{
        btCollisionObjectFloatData* colObjData = arrays->m_collisionObjectDataFloat[i];
        btCollisionShape** shapePtr = m_shapeMap.find(colObjData->m_collisionShape);
        if (shapePtr && *shapePtr)
        {
            btTransform startTransform;
            colObjData->m_worldTransform.m_origin.m_floats[3] = 0.f;
            startTransform.deSerializeFloat(colObjData->m_worldTransform);

            btCollisionShape* shape = (btCollisionShape*)*shapePtr;
            btCollisionObject* body = createCollisionObject(startTransform,shape,colObjData->m_name);

#ifdef USE_INTERNAL_EDGE_UTILITY
            if (shape->getShapeType() == TRIANGLE_MESH_SHAPE_PROXYTYPE)
            {
                btBvhTriangleMeshShape* trimesh = (btBvhTriangleMeshShape*)shape;
                if (trimesh->getTriangleInfoMap())
                {
                    body->setCollisionFlags(body->getCollisionFlags()  | btCollisionObject::CF_CUSTOM_MATERIAL_CALLBACK);
                }
            }
#endif //USE_INTERNAL_EDGE_UTILITY
            m_bodyMap.insert(colObjData,body);
        } else
        {
            printf("error: no shape found\n");
        }
    }

	return true;
}